

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O1

void mdb_dpage_free(MDB_env *env,MDB_page *dp)

{
  if (((dp->mp_flags & 4) != 0) && ((dp->mp_pb).pb_pages != 1)) {
    free(dp);
    return;
  }
  dp->mp_p = (anon_union_8_2_b62042e6_for_mp_p)env->me_dpages;
  env->me_dpages = dp;
  return;
}

Assistant:

static void
mdb_dpage_free(MDB_env *env, MDB_page *dp)
{
	if (!IS_OVERFLOW(dp) || dp->mp_pages == 1) {
		mdb_page_free(env, dp);
	} else {
		/* large pages just get freed directly */
		VGMEMP_FREE(env, dp);
		free(dp);
	}
}